

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

int fileOut_object(FILE *fp,object *obj)

{
  object **ppoVar1;
  
  if (inSpaceOne == 0) {
    ppoVar1 = &spaceOne;
  }
  else {
    ppoVar1 = &spaceTwo;
  }
  indirArray = (object **)*ppoVar1;
  indirtop = 0;
  info_impl("fileOut_object_version_3",0x1ae,"Writing out image version 3.");
  put_image_version(fp,'\x03');
  objectWrite(fp,obj);
  return indirtop;
}

Assistant:

int fileOut_object(FILE *fp, struct object *obj)
{
    return fileOut_object_version_3(fp, obj);
}